

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_rawget(lua_State *L,int idx)

{
  StkId pSVar1;
  long lVar2;
  lu_byte lVar3;
  TValue *pTVar4;
  TValue *io1;
  
  pTVar4 = index2value(L,idx);
  pTVar4 = luaH_get((Table *)(pTVar4->value_).gc,(TValue *)((L->top).offset + -0x10));
  lVar2 = (L->top).offset;
  pSVar1 = (StkId)(lVar2 + -0x10);
  (L->top).p = pSVar1;
  if ((pTVar4->tt_ & 0xf) == 0) {
    lVar3 = '\0';
  }
  else {
    (pSVar1->val).value_ = pTVar4->value_;
    lVar3 = pTVar4->tt_;
  }
  *(lu_byte *)(lVar2 + -8) = lVar3;
  lVar2 = (L->top).offset;
  (L->top).p = (StkId)(lVar2 + 0x10);
  return *(byte *)(lVar2 + 8) & 0xf;
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  Table *t;
  const TValue *val;
  lua_lock(L);
  api_checknelems(L, 1);
  t = gettable(L, idx);
  val = luaH_get(t, s2v(L->top.p - 1));
  L->top.p--;  /* remove key */
  return finishrawget(L, val);
}